

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFUnitIndex.cpp
# Opt level: O0

bool __thiscall
llvm::DWARFUnitIndex::Header::parse(Header *this,DataExtractor IndexData,uint64_t *OffsetPtr)

{
  bool bVar1;
  uint32_t uVar2;
  uint64_t *OffsetPtr_local;
  Header *this_local;
  
  bVar1 = DataExtractor::isValidOffsetForDataOfSize(&IndexData,*OffsetPtr,0x10);
  if (bVar1) {
    uVar2 = DataExtractor::getU32(&IndexData,OffsetPtr,(Error *)0x0);
    this->Version = uVar2;
    uVar2 = DataExtractor::getU32(&IndexData,OffsetPtr,(Error *)0x0);
    this->NumColumns = uVar2;
    uVar2 = DataExtractor::getU32(&IndexData,OffsetPtr,(Error *)0x0);
    this->NumUnits = uVar2;
    uVar2 = DataExtractor::getU32(&IndexData,OffsetPtr,(Error *)0x0);
    this->NumBuckets = uVar2;
    this_local._7_1_ = this->Version < 3;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool DWARFUnitIndex::Header::parse(DataExtractor IndexData,
                                   uint64_t *OffsetPtr) {
  if (!IndexData.isValidOffsetForDataOfSize(*OffsetPtr, 16))
    return false;
  Version = IndexData.getU32(OffsetPtr);
  NumColumns = IndexData.getU32(OffsetPtr);
  NumUnits = IndexData.getU32(OffsetPtr);
  NumBuckets = IndexData.getU32(OffsetPtr);
  return Version <= 2;
}